

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3MatchSpanName(char *zSpan,char *zCol,char *zTab,char *zDb)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  uchar *b;
  long lVar5;
  byte *pbVar6;
  byte *zLeft;
  
  lVar5 = 0;
  for (zLeft = (byte *)(zSpan + 1); (zLeft[-1] != 0 && (zLeft[-1] != 0x2e)); zLeft = zLeft + 1) {
    lVar5 = lVar5 + 1;
  }
  if (zDb != (char *)0x0) {
    iVar4 = sqlite3_strnicmp(zSpan,zDb,(int)lVar5);
    if (iVar4 != 0) {
      return 0;
    }
    if (zDb[lVar5] != '\0') {
      return 0;
    }
  }
  lVar5 = 0;
  pbVar3 = zLeft;
  while( true ) {
    pbVar6 = pbVar3 + 1;
    if ((*pbVar3 == 0) || (*pbVar3 == 0x2e)) break;
    lVar5 = lVar5 + 1;
    pbVar3 = pbVar6;
  }
  if (zTab != (char *)0x0) {
    iVar4 = sqlite3_strnicmp((char *)zLeft,zTab,(int)lVar5);
    if (iVar4 != 0) {
      return 0;
    }
    if (zTab[lVar5] != '\0') {
      return 0;
    }
  }
  if (zCol == (char *)0x0) {
    return 1;
  }
  do {
    bVar1 = *pbVar6;
    bVar2 = *zCol;
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_0019bdcc;
    }
    else if (""[bVar1] != ""[bVar2]) {
LAB_0019bdcc:
      if (bVar1 == bVar2) {
        return 1;
      }
      return 0;
    }
    zCol = (char *)((byte *)zCol + 1);
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchSpanName(
  const char *zSpan,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}